

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  TestFilter *pTVar1;
  TestFilter *pTVar2;
  TestFilter *current_1;
  TestFilter *current;
  CommandLineArguments *this_local;
  
  this->_vptr_CommandLineArguments = (_func_int **)&PTR__CommandLineArguments_0018ad78;
  while (this->groupFilters_ != (TestFilter *)0x0) {
    pTVar1 = this->groupFilters_;
    pTVar2 = TestFilter::getNext(this->groupFilters_);
    this->groupFilters_ = pTVar2;
    if (pTVar1 != (TestFilter *)0x0) {
      TestFilter::~TestFilter(pTVar1);
      operator_delete(pTVar1,0x20);
    }
  }
  while (this->nameFilters_ != (TestFilter *)0x0) {
    pTVar1 = this->nameFilters_;
    pTVar2 = TestFilter::getNext(this->nameFilters_);
    this->nameFilters_ = pTVar2;
    if (pTVar1 != (TestFilter *)0x0) {
      TestFilter::~TestFilter(pTVar1);
      operator_delete(pTVar1,0x20);
    }
  }
  SimpleString::~SimpleString(&this->packageName_);
  return;
}

Assistant:

CommandLineArguments::~CommandLineArguments()
{
    while(groupFilters_) {
        TestFilter* current = groupFilters_;
        groupFilters_ = groupFilters_->getNext();
        delete current;
    }
    while(nameFilters_) {
        TestFilter* current = nameFilters_;
        nameFilters_ = nameFilters_->getNext();
        delete current;
    }
}